

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::WriteHighLevelDirectives
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmake *this_00;
  cmValue v;
  ostream *poVar4;
  string *psVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char local_71;
  string local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  pcVar2 = root->Makefile;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GHS_PRIMARY_TARGET","");
  v = cmMakefile::GetDefinition(pcVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"primaryTarget=",0xe);
  poVar4 = operator<<(fout,v);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\ncustomization=",0xf);
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"/CMakeFiles/custom_rule.bod\ncustomization=",0x2a);
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(root);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/CMakeFiles/custom_target.bod",0x1d);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_70,1);
  pcVar2 = root->Makefile;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GHS_CUSTOMIZATION","");
  psVar5 = (string *)cmMakefile::GetDefinition(pcVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((psVar5 != (string *)0x0) && (psVar5->_M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"customization=",0xe);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar3 = (psVar5->_M_dataplus)._M_p;
    local_50._M_current = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + psVar5->_M_string_length);
    local_71 = '\"';
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_50,local_50._M_current + local_48,&local_71);
    local_70._M_string_length = (long)_Var6._M_current - (long)local_50._M_current;
    *_Var6._M_current = '\0';
    if (local_50._M_current == &local_40) {
      local_70.field_2._8_8_ = uStack_38;
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70._M_dataplus._M_p = local_50._M_current;
    }
    local_70.field_2._M_allocated_capacity._1_7_ = uStack_3f;
    local_70.field_2._M_local_buf[0] = local_40;
    local_48 = 0;
    local_40 = '\0';
    local_50._M_current = &local_40;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_70._M_dataplus._M_p,local_70._M_string_length);
    local_71 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_71,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_current != &local_40) {
      operator_delete(local_50._M_current,CONCAT71(uStack_3f,local_40) + 1);
    }
    this_00 = (this->super_cmGlobalGenerator).CMakeInstance;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GHS_CUSTOMIZATION","");
    cmake::MarkCliAsUsed(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteHighLevelDirectives(
  std::ostream& fout, cmLocalGenerator* root)
{
  /* put primary target and customization files into project file */
  cmValue const tgt = root->GetMakefile()->GetDefinition("GHS_PRIMARY_TARGET");

  /* clang-format off */
  fout << "primaryTarget=" << tgt << "\n"
          "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_rule.bod\n"
          "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_target.bod" << '\n';
  /* clang-format on */

  cmValue const customization =
    root->GetMakefile()->GetDefinition("GHS_CUSTOMIZATION");
  if (cmNonempty(customization)) {
    fout << "customization="
         << cmGlobalGhsMultiGenerator::TrimQuotes(*customization) << '\n';
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_CUSTOMIZATION");
  }
}